

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O3

void rapidjson::internal::DigitGen(DiyFp *W,DiyFp *Mp,uint64_t delta,char *buffer,int *len,int *K)

{
  uint64_t uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  char cVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  
  bVar2 = -(char)Mp->e;
  uVar8 = 1L << (bVar2 & 0x3f);
  uVar5 = Mp->f;
  uVar11 = uVar5 >> (bVar2 & 0x3f);
  uVar1 = W->f;
  uVar15 = 1;
  uVar7 = (uint)uVar11;
  if (((((9 < uVar7) && (uVar15 = 2, 99 < uVar7)) && (uVar15 = 3, 999 < uVar7)) &&
      ((uVar15 = 4, 9999 < uVar7 && (uVar15 = 5, 99999 < uVar7)))) &&
     ((uVar15 = 6, 999999 < uVar7 && (uVar15 = 7, 9999999 < uVar7)))) {
    uVar15 = (ulong)(9 - (uVar7 < 100000000));
  }
  uVar3 = uVar5 - uVar1;
  uVar4 = uVar8 - 1 & uVar5;
  *len = 0;
  do {
    uVar7 = (uint)uVar11;
    if ((int)uVar15 < 1) {
      uVar7 = 0;
      do {
        uVar5 = delta;
        cVar9 = (char)(uVar4 * 10 >> (bVar2 & 0x3f));
        iVar6 = *len;
        if (cVar9 != '\0' || iVar6 != 0) {
          *len = iVar6 + 1;
          buffer[iVar6] = cVar9 + '0';
        }
        delta = uVar5 * 10;
        uVar4 = uVar4 * 10 & uVar8 - 1;
        uVar7 = uVar7 + 1;
      } while (delta < uVar4 || delta - uVar4 == 0);
      *K = *K - uVar7;
      if ((int)(1 - uVar7) < -7) {
        uVar7 = 0;
      }
      else {
        uVar7 = DigitGen::kPow10[uVar7];
      }
      if (uVar8 <= delta - uVar4) {
        uVar3 = uVar7 * uVar3;
        uVar11 = uVar3 - uVar4;
        if (uVar3 < uVar4 || uVar11 == 0) {
          return;
        }
        iVar6 = *len;
        uVar4 = uVar4 + uVar8;
        uVar5 = uVar5 * 10 - uVar4;
        do {
          if ((uVar3 <= uVar4) && (uVar11 <= uVar4 - uVar3)) {
            return;
          }
          buffer[(long)iVar6 + -1] = buffer[(long)iVar6 + -1] + -1;
          bVar16 = uVar8 <= uVar5;
          uVar5 = uVar5 - uVar8;
          if (uVar3 <= uVar4) {
            return;
          }
          uVar11 = uVar11 - uVar8;
          uVar4 = uVar4 + uVar8;
        } while (bVar16);
        return;
      }
      return;
    }
    uVar14 = (int)uVar15 - 1;
    uVar15 = (ulong)uVar14;
    switch(uVar15) {
    case 0:
      uVar12 = 0;
      goto LAB_0012013f;
    case 1:
      uVar10 = (uint)((uVar11 & 0xffffffff) / 10);
      iVar6 = (int)((uVar11 & 0xffffffff) / 10) * 10;
      break;
    case 2:
      uVar10 = (uint)((uVar11 & 0xffffffff) / 100);
      iVar6 = (int)((uVar11 & 0xffffffff) / 100) * 100;
      break;
    case 3:
      uVar10 = (uint)((uVar11 & 0xffffffff) / 1000);
      iVar6 = (int)((uVar11 & 0xffffffff) / 1000) * 1000;
      break;
    case 4:
      uVar10 = (uint)((uVar11 & 0xffffffff) / 10000);
      iVar6 = (int)((uVar11 & 0xffffffff) / 10000) * 10000;
      break;
    case 5:
      uVar10 = (uVar7 >> 5) / 0xc35;
      iVar6 = ((uVar7 >> 5) / 0xc35) * 100000;
      break;
    case 6:
      uVar10 = (uint)((uVar11 & 0xffffffff) / 1000000);
      iVar6 = (int)((uVar11 & 0xffffffff) / 1000000) * 1000000;
      break;
    case 7:
      uVar10 = (uint)((uVar11 & 0xffffffff) / 10000000);
      iVar6 = (int)((uVar11 & 0xffffffff) / 10000000) * 10000000;
      break;
    case 8:
      uVar10 = (uint)((uVar11 & 0xffffffff) / 100000000);
      iVar6 = (int)((uVar11 & 0xffffffff) / 100000000) * 100000000;
      break;
    default:
      iVar6 = *len;
      uVar12 = uVar7;
      goto LAB_0012015b;
    }
    uVar12 = uVar7 - iVar6;
    uVar7 = uVar10;
LAB_0012013f:
    iVar6 = *len;
    if (uVar7 == 0) {
      uVar11 = (ulong)uVar12;
LAB_0012015b:
      cVar9 = '0';
      if (iVar6 != 0) goto LAB_00120163;
    }
    else {
      cVar9 = (char)uVar7 + '0';
LAB_00120163:
      *len = iVar6 + 1;
      buffer[iVar6] = cVar9;
      uVar11 = (ulong)uVar12;
    }
    uVar13 = ((uVar11 & 0xffffffff) << (bVar2 & 0x3f)) + uVar4;
    if (uVar13 <= delta) {
      *K = *K + uVar14;
      uVar8 = (ulong)DigitGen::kPow10[uVar15] << (bVar2 & 0x3f);
      if ((uVar13 < uVar3) && (uVar8 <= delta - uVar13)) {
        iVar6 = *len;
        uVar15 = uVar3 - uVar13;
        uVar13 = uVar13 + uVar8;
        uVar11 = delta - uVar13;
        do {
          if ((uVar3 <= uVar13) && (uVar15 <= (uVar1 - uVar5) + uVar13)) {
            return;
          }
          buffer[(long)iVar6 + -1] = buffer[(long)iVar6 + -1] + -1;
          bVar16 = uVar8 <= uVar11;
          uVar11 = uVar11 - uVar8;
          if (uVar3 <= uVar13) {
            return;
          }
          uVar15 = uVar15 - uVar8;
          uVar13 = uVar13 + uVar8;
        } while (bVar16);
      }
      return;
    }
  } while( true );
}

Assistant:

inline void DigitGen(const DiyFp& W, const DiyFp& Mp, uint64_t delta, char* buffer, int* len, int* K) {
    static const uint32_t kPow10[] = { 1, 10, 100, 1000, 10000, 100000, 1000000, 10000000, 100000000, 1000000000 };
    const DiyFp one(uint64_t(1) << -Mp.e, Mp.e);
    const DiyFp wp_w = Mp - W;
    uint32_t p1 = static_cast<uint32_t>(Mp.f >> -one.e);
    uint64_t p2 = Mp.f & (one.f - 1);
    int kappa = CountDecimalDigit32(p1); // kappa in [0, 9]
    *len = 0;

    while (kappa > 0) {
        uint32_t d = 0;
        switch (kappa) {
            case  9: d = p1 /  100000000; p1 %=  100000000; break;
            case  8: d = p1 /   10000000; p1 %=   10000000; break;
            case  7: d = p1 /    1000000; p1 %=    1000000; break;
            case  6: d = p1 /     100000; p1 %=     100000; break;
            case  5: d = p1 /      10000; p1 %=      10000; break;
            case  4: d = p1 /       1000; p1 %=       1000; break;
            case  3: d = p1 /        100; p1 %=        100; break;
            case  2: d = p1 /         10; p1 %=         10; break;
            case  1: d = p1;              p1 =           0; break;
            default:;
        }
        if (d || *len)
            buffer[(*len)++] = static_cast<char>('0' + static_cast<char>(d));
        kappa--;
        uint64_t tmp = (static_cast<uint64_t>(p1) << -one.e) + p2;
        if (tmp <= delta) {
            *K += kappa;
            GrisuRound(buffer, *len, delta, tmp, static_cast<uint64_t>(kPow10[kappa]) << -one.e, wp_w.f);
            return;
        }
    }

    // kappa = 0
    for (;;) {
        p2 *= 10;
        delta *= 10;
        char d = static_cast<char>(p2 >> -one.e);
        if (d || *len)
            buffer[(*len)++] = static_cast<char>('0' + d);
        p2 &= one.f - 1;
        kappa--;
        if (p2 < delta) {
            *K += kappa;
            int index = -kappa;
            GrisuRound(buffer, *len, delta, p2, one.f, wp_w.f * (index < 9 ? kPow10[index] : 0));
            return;
        }
    }
}